

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall EventHandler::OnPlayerJoin(EventHandler *this,IPlayer *player)

{
  CmdHandl *pCVar1;
  allocator<char16_t> local_51;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  u16string local_30 [32];
  
  pCVar1 = cmdh;
  std::__cxx11::u16string::u16string(local_30,L"help",&local_51);
  local_50[1] = (code *)0x0;
  local_50[0] = CmdList::help;
  local_38 = std::
             _Function_handler<void_(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&),_void_(*)(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&),_void_(*)(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&)>
             ::_M_manager;
  (**pCVar1->_vptr_CmdHandl)(pCVar1,local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  std::__cxx11::u16string::~u16string(local_30);
  return;
}

Assistant:

void EventHandler::OnPlayerJoin( rage::IPlayer *player)
{
	cmdh->addCommand(u"help", CmdList::help);
}